

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

void __thiscall diy::FileStorage::remove_file(FileStorage *this,FileRecord *fr)

{
  size_t sVar1;
  int __type;
  undefined1 local_30 [24];
  
  io::utils::remove((char *)&fr->name);
  sVar1 = fr->size;
  critical_resource<unsigned_long,_tthread::fast_mutex>::access
            ((critical_resource<unsigned_long,_tthread::fast_mutex> *)local_30,
             (char *)&this->current_size_,__type);
  *(size_t *)local_30._0_8_ = *(long *)local_30._0_8_ - sVar1;
  std::unique_lock<tthread::fast_mutex>::~unique_lock
            ((unique_lock<tthread::fast_mutex> *)(local_30 + 8));
  return;
}

Assistant:

void          remove_file(const FileRecord& fr)
      {
        io::utils::remove(fr.name);
        (*current_size_.access()) -= fr.size;
      }